

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O3

size_t Output::TraceWithPrefix(Phase phase,char16 *prefix,char16 *form,...)

{
  bool bVar1;
  size_t sVar2;
  char16 local_4f8 [4];
  WCHAR prefixValue [512];
  undefined1 local_48 [8];
  va_list argptr;
  
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,phase);
  if (bVar1) {
    argptr[0].overflow_arg_area = prefixValue + 0x1fc;
    argptr[0]._0_8_ = &stack0x00000008;
    local_48._0_4_ = 0x18;
    local_48._4_4_ = 0x30;
    _snwprintf_unsafe(local_4f8,0x200,0xffffffffffffffff,L"%s: %s: ",(&Js::PhaseNames)[phase],prefix
                     );
    sVar2 = VTrace(L"%s",local_4f8,form,(__va_list_tag *)local_48);
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t __cdecl
Output::TraceWithPrefix(Js::Phase phase, const char16 prefix[], const char16 *form, ...)
{
    size_t retValue = 0;

    if (Js::Configuration::Global.flags.Trace.IsEnabled(phase))
    {
        va_list argptr;
        va_start(argptr, form);
        WCHAR prefixValue[512];
        _snwprintf_s(prefixValue, _countof(prefixValue), _TRUNCATE, _u("%s: %s: "), Js::PhaseNames[static_cast<int>(phase)], prefix);
        retValue += Output::VTrace(_u("%s"), prefixValue, form, argptr);
        va_end(argptr);
    }

    return retValue;
}